

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QModelIndex * __thiscall
QTableView::moveCursor(QTableView *this,CursorAction cursorAction,KeyboardModifiers modifiers)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Int IVar11;
  uint uVar12;
  QTableViewPrivate *pQVar13;
  int in_EDX;
  long *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int logicalColumn;
  int logicalRow;
  int visualRow_2;
  int newLogicalRow_1;
  int visualRow_1;
  int newLogicalRow;
  int c_3;
  int r_3;
  bool wrapped_1;
  bool looped_1;
  bool firstTime_1;
  int originalColumn_1;
  int originalRow_3;
  int c_2;
  int r_2;
  bool wrapped;
  bool looped;
  bool firstTime;
  int originalColumn;
  int originalRow_2;
  int c_1;
  int r_1;
  int originalRow_1;
  int c;
  int r;
  int originalRow;
  int visualColumn;
  int visualRow;
  int column;
  int row;
  int right;
  int bottom;
  QTableViewPrivate *d;
  QModelIndex result;
  QPoint visualCurrent;
  QModelIndex current;
  Span span_6;
  Span span_5;
  Span span_4;
  Span span_3;
  Span span_2;
  Span span_1;
  Span span;
  int in_stack_fffffffffffffc28;
  KeyboardModifier in_stack_fffffffffffffc2c;
  QTableViewPrivate *in_stack_fffffffffffffc30;
  QAbstractItemModel *pQVar14;
  int in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  QTableViewPrivate *in_stack_fffffffffffffc40;
  QTableViewPrivate *this_00;
  SearchDirection in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  QTableViewPrivate *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  bool local_282;
  bool local_281;
  bool local_271;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1d4;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  QAbstractItemModel *local_1b8;
  QPersistentModelIndex local_1b0 [3];
  undefined1 *local_198;
  undefined1 *local_190;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_188;
  QPersistentModelIndex local_180 [3];
  QPoint local_168;
  QPersistentModelIndex local_160 [3];
  undefined1 local_148 [16];
  QPersistentModelIndex local_138 [3];
  undefined1 local_120 [16];
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_110;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_10c;
  QPoint local_108;
  QPersistentModelIndex local_100 [3];
  QPoint local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_d0;
  QPersistentModelIndex local_c8 [3];
  QPersistentModelIndex local_b0 [3];
  undefined1 *local_94;
  undefined1 *local_8c;
  undefined4 local_84;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined4 local_70;
  undefined1 *local_6c;
  undefined1 *local_64;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined4 local_48;
  undefined1 *local_44;
  undefined1 *local_3c;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined4 local_20;
  undefined1 *local_1c;
  undefined1 *local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = d_func((QTableView *)0x8b89d7);
  pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_b0);
  local_1e4 = (**(code **)(*(long *)pQVar14 + 0x78))(pQVar14,local_b0);
  do {
    local_1e4 = local_1e4 + -1;
    local_271 = false;
    if (-1 < local_1e4) {
      QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      local_271 = isRowHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    }
  } while (local_271 != false);
  pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_c8);
  local_1e8 = (**(code **)(*(long *)pQVar14 + 0x80))(pQVar14,local_c8);
  do {
    iVar6 = local_1e8;
    local_1e8 = iVar6 + -1;
    local_281 = false;
    if (-1 < local_1e8) {
      QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      local_281 = isColumnHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    }
  } while (local_281 != false);
  if ((local_1e4 == -1) || (local_1e8 == -1)) {
    QModelIndex::QModelIndex((QModelIndex *)0x8b8b63);
    goto LAB_008ba2c9;
  }
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QAbstractItemView *)in_stack_fffffffffffffc40);
  bVar3 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffc30);
  if (!bVar3) {
    local_1ec = 0;
    local_1f0 = 0;
    while( true ) {
      local_282 = false;
      if (local_1f0 < local_1e8) {
        QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
        local_282 = isColumnHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c
                                  );
      }
      if (local_282 == false) break;
      local_1f0 = local_1f0 + 1;
    }
    while( true ) {
      QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      bVar3 = isRowHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      if (!bVar3 || local_1e4 <= local_1ec) break;
      local_1ec = local_1ec + 1;
    }
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                   in_stack_fffffffffffffc28);
    pQVar13->visualCursor = local_e8;
    pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
    iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    iVar7 = QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_100);
    (**(code **)(*(long *)pQVar14 + 0x60))(in_RDI,pQVar14,iVar6,iVar7,local_100);
    goto LAB_008ba2c9;
  }
  local_108 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::column((QModelIndex *)&local_e0);
  QTableViewPrivate::visualColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  QModelIndex::row((QModelIndex *)&local_e0);
  QTableViewPrivate::visualRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                 in_stack_fffffffffffffc28);
  bVar3 = ::operator!=((QPoint *)in_stack_fffffffffffffc30,
                       (QPoint *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  if (bVar3) {
    bVar3 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b8e29);
    if (bVar3) {
      local_1c = &DAT_aaaaaaaaaaaaaaaa;
      local_14 = &DAT_aaaaaaaaaaaaaaaa;
      local_c._0_1_ = true;
      local_c._1_3_ = 0xaaaaaa;
      QModelIndex::row((QModelIndex *)&local_e0);
      QModelIndex::column((QModelIndex *)&local_e0);
      QTableViewPrivate::span
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
      iVar7 = QSpanCollection::Span::top((Span *)&local_1c);
      iVar8 = QPoint::y((QPoint *)0x8b8ed4);
      if (iVar7 <= iVar8) {
        iVar7 = QPoint::y((QPoint *)0x8b8ef9);
        iVar8 = QSpanCollection::Span::bottom((Span *)&local_1c);
        if (iVar7 <= iVar8) {
          iVar7 = QSpanCollection::Span::left((Span *)&local_1c);
          iVar8 = QPoint::x((QPoint *)0x8b8f42);
          if (iVar7 <= iVar8) {
            iVar7 = QPoint::x((QPoint *)0x8b8f63);
            iVar8 = QSpanCollection::Span::right((Span *)&local_1c);
            if (iVar7 <= iVar8) goto LAB_008b8fb6;
          }
        }
      }
      pQVar13->visualCursor = local_108;
    }
    else {
      pQVar13->visualCursor = local_108;
    }
  }
LAB_008b8fb6:
  local_1f4 = QPoint::y((QPoint *)0x8b8fca);
  if (local_1e4 < local_1f4) {
    local_1f4 = local_1e4;
  }
  iVar7 = local_1f4;
  local_1f8 = QPoint::x((QPoint *)0x8b9003);
  if (local_1e8 < local_1f8) {
    local_1f8 = local_1e8;
  }
  iVar8 = local_1f8;
  bVar3 = QWidget::isRightToLeft((QWidget *)0x8b9035);
  local_1d4 = in_EDX;
  if (bVar3) {
    if (in_EDX == 2) {
      local_1d4 = 3;
    }
    else if (in_EDX == 3) {
      local_1d4 = 2;
    }
  }
  iVar9 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  switch(local_1d4) {
  case 0:
    iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    if ((iVar6 != -1) && (bVar3 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b90fc), bVar3)
       ) {
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20._0_1_ = true;
      local_20._1_3_ = 0xaaaaaa;
      QTableViewPrivate::span
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
      iVar6 = QSpanCollection::Span::width((Span *)&local_30);
      if ((1 < iVar6) || (iVar6 = QSpanCollection::Span::height((Span *)&local_30), 1 < iVar6)) {
        QSpanCollection::Span::top((Span *)&local_30);
        local_1f4 = QTableViewPrivate::visualRow
                              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      }
    }
    while (-1 < local_1f4) {
      local_1f4 = local_1f4 + -1;
      iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      if ((iVar6 == -1) ||
         ((bVar3 = isRowHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c),
          !bVar3 && (bVar3 = QTableViewPrivate::isCellEnabled
                                       ((QTableViewPrivate *)
                                        CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58
                                                ),(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                                        (int)in_stack_fffffffffffffc50), bVar3)))) break;
    }
    break;
  case 1:
    bVar3 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b9285);
    if (bVar3) {
      local_44 = &DAT_aaaaaaaaaaaaaaaa;
      local_3c = &DAT_aaaaaaaaaaaaaaaa;
      local_34._0_1_ = true;
      local_34._1_3_ = 0xaaaaaa;
      QModelIndex::row((QModelIndex *)&local_e0);
      QModelIndex::column((QModelIndex *)&local_e0);
      QTableViewPrivate::span
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
      QSpanCollection::Span::top((Span *)&local_44);
      QSpanCollection::Span::height((Span *)&local_44);
      QTableViewPrivate::rowSpanEndLogical
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28);
      local_1f4 = QTableViewPrivate::visualRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    }
    iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    if ((iVar6 != -1) && (bVar3 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b93c6), bVar3)
       ) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_1_ = true;
      local_48._1_3_ = 0xaaaaaa;
      QTableViewPrivate::span
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
      iVar6 = QSpanCollection::Span::width((Span *)&local_58);
      if ((1 < iVar6) || (iVar6 = QSpanCollection::Span::height((Span *)&local_58), 1 < iVar6)) {
        QSpanCollection::Span::top((Span *)&local_58);
        QSpanCollection::Span::height((Span *)&local_58);
        QTableViewPrivate::rowSpanEndLogical
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28);
        local_1f4 = QTableViewPrivate::visualRow
                              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      }
    }
    while (local_1f4 <= local_1e4) {
      local_1f4 = local_1f4 + 1;
      iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      if ((iVar6 == -1) ||
         ((bVar3 = isRowHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c),
          !bVar3 && (bVar3 = QTableViewPrivate::isCellEnabled
                                       ((QTableViewPrivate *)
                                        CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58
                                                ),(int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                                        (int)in_stack_fffffffffffffc50), bVar3)))) break;
    }
    break;
  case 2:
  case 9:
    bVar3 = true;
    bVar2 = false;
    bVar1 = false;
    do {
      QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      iVar9 = QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      if (((bVar3) && (iVar9 != -1)) &&
         (bVar4 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b960d), bVar4)) {
        bVar3 = false;
        local_6c = &DAT_aaaaaaaaaaaaaaaa;
        local_64 = &DAT_aaaaaaaaaaaaaaaa;
        local_5c._0_1_ = true;
        local_5c._1_3_ = 0xaaaaaa;
        QTableViewPrivate::span
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
        iVar9 = QSpanCollection::Span::width((Span *)&local_6c);
        if ((1 < iVar9) || (iVar9 = QSpanCollection::Span::height((Span *)&local_6c), 1 < iVar9)) {
          QSpanCollection::Span::left((Span *)&local_6c);
          local_1f8 = QTableViewPrivate::visualColumn
                                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
        }
      }
      do {
        if (local_1f8 < 0) goto LAB_008b97cc;
        local_1f8 = local_1f8 + -1;
        iVar9 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
        iVar10 = QTableViewPrivate::logicalColumn
                           (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
        if (((iVar9 == -1) || (iVar10 == -1)) ||
           ((bVar4 = isRowHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c),
            !bVar4 && ((bVar4 = isColumnHidden((QTableView *)in_stack_fffffffffffffc30,
                                               in_stack_fffffffffffffc2c), !bVar4 &&
                       (bVar4 = QTableViewPrivate::isCellEnabled
                                          ((QTableViewPrivate *)
                                           CONCAT44(in_stack_fffffffffffffc5c,
                                                    in_stack_fffffffffffffc58),
                                           (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                                           (int)in_stack_fffffffffffffc50), bVar4))))))
        goto LAB_008b97cc;
      } while ((!bVar1) || ((local_1f4 <= iVar7 && ((iVar7 != local_1f4 || (local_1f8 < iVar8))))));
      bVar2 = true;
LAB_008b97cc:
      if ((local_1d4 == 2) || (-1 < local_1f8)) break;
      if (local_1f4 == 0) {
        bVar1 = true;
        local_1f4 = local_1e4;
      }
      else {
        local_1f4 = local_1f4 + -1;
      }
      local_1f8 = iVar6;
    } while (!bVar2);
    break;
  case 3:
  case 8:
    bVar3 = true;
    bVar2 = false;
    bVar1 = false;
    do {
      QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      iVar6 = QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
      if (((bVar3) && (iVar6 != -1)) &&
         (bVar4 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b98e9), bVar4)) {
        bVar3 = false;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_70._0_1_ = true;
        local_70._1_3_ = 0xaaaaaa;
        QTableViewPrivate::span
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
        iVar6 = QSpanCollection::Span::width((Span *)&local_80);
        if ((1 < iVar6) || (iVar6 = QSpanCollection::Span::height((Span *)&local_80), 1 < iVar6)) {
          QSpanCollection::Span::left((Span *)&local_80);
          QSpanCollection::Span::width((Span *)&local_80);
          QTableViewPrivate::columnSpanEndLogical
                    (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28);
          local_1f8 = QTableViewPrivate::visualColumn
                                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
        }
      }
      do {
        if (local_1e8 < local_1f8) goto LAB_008b9ae8;
        local_1f8 = local_1f8 + 1;
        iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
        iVar9 = QTableViewPrivate::logicalColumn
                          (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
        if (((iVar6 == -1) || (iVar9 == -1)) ||
           ((bVar4 = isRowHidden((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c),
            !bVar4 && ((bVar4 = isColumnHidden((QTableView *)in_stack_fffffffffffffc30,
                                               in_stack_fffffffffffffc2c), !bVar4 &&
                       (bVar4 = QTableViewPrivate::isCellEnabled
                                          ((QTableViewPrivate *)
                                           CONCAT44(in_stack_fffffffffffffc5c,
                                                    in_stack_fffffffffffffc58),
                                           (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                                           (int)in_stack_fffffffffffffc50), bVar4))))))
        goto LAB_008b9ae8;
      } while ((!bVar1) || ((iVar7 <= local_1f4 && ((iVar7 != local_1f4 || (iVar8 < local_1f8))))));
      bVar2 = true;
LAB_008b9ae8:
      if ((local_1d4 == 3) || (local_1f8 <= local_1e8)) break;
      local_1f8 = -1;
      if (local_1f4 == local_1e4) {
        bVar1 = true;
        local_1f4 = 0;
      }
      else {
        local_1f4 = local_1f4 + 1;
      }
    } while (!bVar2);
    break;
  case 4:
    QTableViewPrivate::nextActiveVisualColumn
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,iVar9,
               (SearchDirection)in_stack_fffffffffffffc40);
    local_10c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffc30,
                    in_stack_fffffffffffffc2c);
    IVar11 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10c);
    if (IVar11 != 0) {
      QTableViewPrivate::nextActiveVisualRow
                ((QTableViewPrivate *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(int)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
    }
    break;
  case 5:
    QTableViewPrivate::nextActiveVisualColumn
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,iVar9,
               (SearchDirection)in_stack_fffffffffffffc40);
    local_110.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffc30,
                    in_stack_fffffffffffffc2c);
    IVar11 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_110);
    if (IVar11 != 0) {
      QTableViewPrivate::nextActiveVisualRow
                ((QTableViewPrivate *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(int)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
    }
    break;
  case 6:
    local_120 = (**(code **)(*in_RSI + 0x1e0))(in_RSI,&local_e0);
    QRect::bottom((QRect *)0x8b9cbb);
    QWidget::height((QWidget *)0x8b9cd6);
    iVar6 = rowAt((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    if (iVar6 != -1) {
      QTableViewPrivate::visualRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    }
    QModelIndex::column((QModelIndex *)&local_e0);
    QTableViewPrivate::nextActiveVisualRow
              ((QTableViewPrivate *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(int)in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
    iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
    iVar7 = QModelIndex::column((QModelIndex *)&local_e0);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_138);
    (**(code **)(*(long *)pQVar14 + 0x60))(in_RDI,pQVar14,iVar6,iVar7,local_138);
    goto LAB_008ba2c9;
  case 7:
    local_148 = (**(code **)(*in_RSI + 0x1e0))(in_RSI,&local_e0);
    QRect::top((QRect *)0x8b9e4e);
    QWidget::height((QWidget *)0x8b9e66);
    iVar6 = rowAt((QTableView *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    if (iVar6 != -1) {
      QTableViewPrivate::visualRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    }
    QModelIndex::column((QModelIndex *)&local_e0);
    QTableViewPrivate::nextActiveVisualRow
              ((QTableViewPrivate *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),(int)in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
    iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
    iVar7 = QModelIndex::column((QModelIndex *)&local_e0);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_160);
    (**(code **)(*(long *)pQVar14 + 0x60))(in_RDI,pQVar14,iVar6,iVar7,local_160);
    goto LAB_008ba2c9;
  }
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                 in_stack_fffffffffffffc28);
  pQVar13->visualCursor = local_168;
  iVar6 = QTableViewPrivate::logicalRow(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  uVar12 = QTableViewPrivate::logicalColumn(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_180);
  bVar5 = QAbstractItemModel::hasIndex((int)pQVar14,iVar6,(QModelIndex *)(ulong)uVar12);
  if (((bVar5 ^ 0xff) & 1) == 0) {
    local_198 = &DAT_aaaaaaaaaaaaaaaa;
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    local_188.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_1b0);
    (**(code **)(*(long *)pQVar14 + 0x60))(&local_198,pQVar14,iVar6,uVar12,local_1b0);
    bVar3 = QTableViewPrivate::isRowHidden(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
    if (((bVar3) ||
        (bVar3 = QTableViewPrivate::isColumnHidden
                           (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c), bVar3)) ||
       (bVar3 = QAbstractItemViewPrivate::isIndexEnabled
                          (&in_stack_fffffffffffffc30->super_QAbstractItemViewPrivate,
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)), !bVar3))
    {
      QModelIndex::QModelIndex((QModelIndex *)0x8ba2c9);
    }
    else {
      bVar3 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8ba16b);
      if (bVar3) {
        local_94 = &DAT_aaaaaaaaaaaaaaaa;
        local_8c = &DAT_aaaaaaaaaaaaaaaa;
        local_84._0_1_ = true;
        local_84._1_3_ = 0xaaaaaa;
        this_00 = pQVar13;
        QModelIndex::row((QModelIndex *)&local_198);
        QModelIndex::column((QModelIndex *)&local_198);
        QTableViewPrivate::span(this_00,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
        iVar6 = QSpanCollection::Span::width((Span *)&local_94);
        if ((1 < iVar6) || (iVar6 = QSpanCollection::Span::height((Span *)&local_94), 1 < iVar6)) {
          pQVar14 = (pQVar13->super_QAbstractItemViewPrivate).model;
          iVar6 = QSpanCollection::Span::top((Span *)&local_94);
          iVar7 = QSpanCollection::Span::left((Span *)&local_94);
          (**(code **)(*(long *)pQVar14 + 0x70))(&local_1c8,pQVar14,iVar6,iVar7,&local_198);
          local_198 = local_1c8;
          local_190 = local_1c0;
          local_188.ptr = local_1b8;
        }
      }
      *(undefined1 **)in_RDI = local_198;
      in_RDI->i = (quintptr)local_190;
      (in_RDI->m).ptr = local_188.ptr;
    }
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x8ba06d);
  }
LAB_008ba2c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTableView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QTableView);
    Q_UNUSED(modifiers);

    int bottom = d->model->rowCount(d->root) - 1;
    // make sure that bottom is the bottommost *visible* row
    while (bottom >= 0 && isRowHidden(d->logicalRow(bottom)))
        --bottom;

    int right = d->model->columnCount(d->root) - 1;

    while (right >= 0 && isColumnHidden(d->logicalColumn(right)))
        --right;

    if (bottom == -1 || right == -1)
        return QModelIndex(); // model is empty

    QModelIndex current = currentIndex();

    if (!current.isValid()) {
        int row = 0;
        int column = 0;
        while (column < right && isColumnHidden(d->logicalColumn(column)))
            ++column;
        while (isRowHidden(d->logicalRow(row)) && row < bottom)
            ++row;
        d->visualCursor = QPoint(column, row);
        return d->model->index(d->logicalRow(row), d->logicalColumn(column), d->root);
    }

    // Update visual cursor if current index has changed.
    QPoint visualCurrent(d->visualColumn(current.column()), d->visualRow(current.row()));
    if (visualCurrent != d->visualCursor) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            if (span.top() > d->visualCursor.y() || d->visualCursor.y() > span.bottom()
                || span.left() > d->visualCursor.x() || d->visualCursor.x() > span.right())
                d->visualCursor = visualCurrent;
        } else {
            d->visualCursor = visualCurrent;
        }
    }

    int visualRow = d->visualCursor.y();
    if (visualRow > bottom)
        visualRow = bottom;
    Q_ASSERT(visualRow != -1);
    int visualColumn = d->visualCursor.x();
    if (visualColumn > right)
        visualColumn = right;
    Q_ASSERT(visualColumn != -1);

    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }

    switch (cursorAction) {
    case MoveUp: {
        int originalRow = visualRow;
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow == 0)
            visualRow = d->visualRow(model()->rowCount() - 1) + 1;
            // FIXME? visualRow = bottom + 1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(span.top());
        }
        while (visualRow >= 0) {
            --visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow < 0)
            visualRow = originalRow;
        break;
    }
    case MoveDown: {
        int originalRow = visualRow;
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow >= bottom)
            visualRow = -1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
        while (visualRow <= bottom) {
            ++visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow > bottom)
            visualRow = originalRow;
        break;
    }
    case MovePrevious:
    case MoveLeft: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(span.left());
            }
            while (visualColumn >= 0) {
                --visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow < visualRow || (originalRow == visualRow && originalColumn <= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveLeft || visualColumn >= 0)
                break;
            visualColumn = right + 1;
            if (visualRow == 0) {
                wrapped = true;
                visualRow = bottom;
            } else {
                --visualRow;
            }
        } while (!looped);
        if (visualColumn < 0)
            visualColumn = originalColumn;
        break;
    }
    case MoveNext:
    case MoveRight: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
            }
            while (visualColumn <= right) {
                ++visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow > visualRow || (originalRow == visualRow && originalColumn >= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveRight || visualColumn <= right)
                break;
            visualColumn = -1;
            if (visualRow == bottom) {
                wrapped = true;
                visualRow = 0;
            } else {
                ++visualRow;
            }
        } while (!looped);
        if (visualColumn > right)
            visualColumn = originalColumn;
        break;
    }
    case MoveHome:
        visualColumn = d->nextActiveVisualColumn(visualRow, 0, right,
                                                 QTableViewPrivate::SearchDirection::Increasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(0, visualColumn, bottom,
                                               QTableViewPrivate::SearchDirection::Increasing);
        break;
    case MoveEnd:
        visualColumn = d->nextActiveVisualColumn(visualRow, right, -1,
                                                 QTableViewPrivate::SearchDirection::Decreasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(bottom, visualColumn, -1,
                                               QTableViewPrivate::SearchDirection::Decreasing);
        break;
    case MovePageUp: {
        int newLogicalRow = rowAt(visualRect(current).bottom() - d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? 0 : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), bottom,
                                           QTableViewPrivate::SearchDirection::Increasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }
    case MovePageDown: {
        int newLogicalRow = rowAt(visualRect(current).top() + d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? bottom : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), -1,
                                           QTableViewPrivate::SearchDirection::Decreasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }}

    d->visualCursor = QPoint(visualColumn, visualRow);
    int logicalRow = d->logicalRow(visualRow);
    int logicalColumn = d->logicalColumn(visualColumn);
    if (!d->model->hasIndex(logicalRow, logicalColumn, d->root))
        return QModelIndex();

    QModelIndex result = d->model->index(logicalRow, logicalColumn, d->root);
    if (!d->isRowHidden(logicalRow) && !d->isColumnHidden(logicalColumn) && d->isIndexEnabled(result)) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(result.row(), result.column());
            if (span.width() > 1 || span.height() > 1) {
                result = d->model->sibling(span.top(), span.left(), result);
            }
        }
        return result;
    }

    return QModelIndex();
}